

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heter_queue.h
# Opt level: O2

put_transaction<void> * __thiscall
density::
heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<256UL>_>
::start_dyn_push_move
          (put_transaction<void> *__return_storage_ptr__,
          heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<256UL>_>
          *this,TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>
                *i_type,void *i_source)

{
  tuple_type *ptVar1;
  Allocation AVar2;
  uintptr_t uint_pointer;
  put_transaction<void> local_48;
  
  ptVar1 = (i_type->m_underlying_type).m_feature_table;
  AVar2 = heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>>>,density_tests::DeepTestAllocator<256ul>>
          ::inplace_allocate<0ul,true>
                    ((heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>>>,density_tests::DeepTestAllocator<256ul>>
                      *)this,(ptVar1->
                             super__Tuple_impl<0UL,_density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>
                             ).super__Head_base<0UL,_density::f_size,_false>._M_head_impl.m_size,
                     (ptVar1->
                     super__Tuple_impl<0UL,_density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>
                     ).
                     super__Tuple_impl<1UL,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>
                     .super__Head_base<1UL,_density::f_alignment,_false>._M_head_impl.m_alignment);
  density_tests::
  TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>
  ::TestRuntimeTime((TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>
                     *)(AVar2.m_control_block + 1),i_type);
  density_tests::
  TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>
  ::move_construct(i_type,AVar2.m_user_storage,i_source);
  __return_storage_ptr__->m_queue =
       (heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_> *)
       this;
  __return_storage_ptr__->m_put_data = AVar2;
  local_48.m_queue =
       (heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_> *)
       0x0;
  local_48.m_put_data = AVar2;
  put_transaction<void>::~put_transaction(&local_48);
  return __return_storage_ptr__;
}

Assistant:

put_transaction<> start_dyn_push_move(const RUNTIME_TYPE & i_type, void * i_source)
        {
            auto push_data = inplace_allocate<0, true>(i_type.size(), i_type.alignment());

            RUNTIME_TYPE * type = nullptr;
            try
            {
                auto const type_storage = type_after_control(push_data.m_control_block);
                DENSITY_ASSUME(type_storage != nullptr);
                type = new (type_storage) RUNTIME_TYPE(i_type);

                DENSITY_ASSUME(push_data.m_user_storage != nullptr);
                i_type.move_construct(push_data.m_user_storage, i_source);
            }
            catch (...)
            {
                if (type != nullptr)
                    type->RUNTIME_TYPE::~RUNTIME_TYPE();
                DENSITY_ASSERT_INTERNAL(
                  (push_data.m_control_block->m_next & (detail::Queue_Busy | detail::Queue_Dead)) ==
                  0);
                push_data.m_control_block->m_next += detail::Queue_Dead;
                throw;
            }

            return put_transaction<void>(PrivateType(), this, push_data);
        }